

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::ConvertIntArg<unsigned_long>
               (unsigned_long v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  undefined2 uVar1;
  char *pcVar2;
  bool bVar3;
  Nonnull<char_*> pcVar4;
  char *pcVar5;
  FormatSinkImpl *in_R8;
  wchar_t v_00;
  IntDigits *buffer;
  undefined1 auVar6 [16];
  string_view v_01;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  FormatConversionSpecImpl local_70;
  IntDigits *local_60;
  size_t local_58;
  undefined2 local_26;
  char local_24;
  char local_23 [3];
  
  conv_02._0_4_ = conv.precision_;
  conv_01._0_8_ = conv._0_8_;
  v_00 = conv._0_4_;
  local_70._0_8_ = conv_01._0_8_;
  local_70.precision_ = conv_02._0_4_;
  switch(conv_01._0_8_ & 0xff) {
  case 0:
    conv_02.precision_ = (int)sink;
    if ((v_00 & 0xff0000U) != 0x20000) {
      conv_01.precision_ = conv_02.precision_;
      anon_unknown_53::ConvertCharImpl
                ((char)v,conv_01,(FormatSinkImpl *)&switchD_00374d76::switchdataD_004a038c);
      return true;
    }
    conv_02.width_ = 0;
    bVar3 = anon_unknown_53::ConvertWCharTImpl((anon_unknown_53 *)v,v_00,conv_02,in_R8);
    return bVar3;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned long]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    buffer = (IntDigits *)&stack0xffffffffffffffb0;
    local_60 = buffer;
    pcVar4 = numbers_internal::FastIntToBuffer(v,(Nonnull<char_*>)buffer);
    goto LAB_00374e91;
  case 4:
    buffer = (IntDigits *)&local_24;
    do {
      *(byte *)((long)buffer + -1) = (byte)v & 7 | 0x30;
      buffer = (IntDigits *)((long)buffer + -1);
      bVar3 = 7 < v;
      v = v >> 3;
    } while (bVar3);
    break;
  case 6:
    pcVar2 = local_23;
    do {
      pcVar5 = pcVar2;
      uVar1 = *(undefined2 *)(numbers_internal::kHexTable + (v & 0xff) * 2);
      *(undefined2 *)(pcVar5 + -3) = uVar1;
      bVar3 = 0xff < v;
      pcVar2 = pcVar5 + -2;
      v = v >> 8;
    } while (bVar3);
    buffer = (IntDigits *)(pcVar5 + -3);
    if ((char)uVar1 == '0') {
      buffer = (IntDigits *)(pcVar5 + -2);
    }
    break;
  case 7:
    buffer = (IntDigits *)&local_24;
    do {
      *(char *)((long)buffer + -1) = "0123456789ABCDEF"[(uint)v & 0xf];
      buffer = (IntDigits *)((long)buffer + -1);
      bVar3 = 0xf < v;
      v = v >> 4;
    } while (bVar3);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    auVar6._8_4_ = (int)(v >> 0x20);
    auVar6._0_8_ = v;
    auVar6._12_4_ = 0x45300000;
    bVar3 = ConvertFloatImpl((auVar6._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0),&local_70,
                             sink);
    return bVar3;
  }
  pcVar4 = &local_24;
  local_60 = buffer;
LAB_00374e91:
  conv_00._0_8_ = (long)pcVar4 - (long)buffer;
  local_58 = conv_00._0_8_;
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_01._M_str = (char *)local_60;
    v_01._M_len = conv_00._0_8_;
    FormatSinkImpl::Append(sink,v_01);
  }
  else {
    conv_00.precision_ = v_00;
    anon_unknown_53::ConvertIntImplInnerSlow
              (local_60,conv_00,(FormatSinkImpl *)(ulong)conv_02._0_4_);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}